

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O2

void leveldb::anon_unknown_35::CleanupIteratorState(void *arg1,void *arg2)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::mutex::lock(*arg1);
  MemTable::Unref(*(MemTable **)((long)arg1 + 0x10));
  if (*(MemTable **)((long)arg1 + 0x18) != (MemTable *)0x0) {
    MemTable::Unref(*(MemTable **)((long)arg1 + 0x18));
  }
  Version::Unref(*(Version **)((long)arg1 + 8));
  pthread_mutex_unlock(*arg1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    operator_delete(arg1,0x20);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void CleanupIteratorState(void* arg1, void* arg2) {
  IterState* state = reinterpret_cast<IterState*>(arg1);
  state->mu->Lock();
  state->mem->Unref();
  if (state->imm != nullptr) state->imm->Unref();
  state->version->Unref();
  state->mu->Unlock();
  delete state;
}